

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_4> *in_RCX;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  MatrixCaseUtils local_84 [12];
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_4,_4> local_60;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_98.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_98.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_98,(Vector<float,_4> *)s_constInVec4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_a8.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_a8.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_a8,(Vector<float,_4> *)(s_constInVec4 + 0x10));
  }
  outerProduct<float,4,4>(&local_60,(MatrixCaseUtils *)&local_98,&local_a8,in_RCX);
  reduceToVec3(local_84,&local_60);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}